

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

M44f * anon_unknown.dwarf_7c237::createRandomMat(Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  float *pfVar1;
  Vec3<float> *in_RDX;
  Matrix44<float> *in_RSI;
  Vec3<float> *in_RDI;
  float a;
  float b;
  double dVar2;
  V3f sh;
  int k;
  int j_1;
  int j;
  V3f h;
  V3f s;
  V3f r;
  V3f t;
  M44f *M;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  Vec3<float> *h_00;
  Matrix44<float> *in_stack_ffffffffffffff90;
  int local_64;
  int local_60;
  int local_5c;
  V3f *in_stack_ffffffffffffffa8;
  V3f *in_stack_ffffffffffffffb0;
  V3f *in_stack_ffffffffffffffb8;
  Rand48 *in_stack_ffffffffffffffc0;
  Vec3<float> local_34 [2];
  
  h_00 = in_RDI;
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)in_RDI);
  Imath_3_2::Vec3<float>::Vec3(local_34);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffc0);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffb4);
  getRandTRS(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  Imath_3_2::Matrix44<float>::translate<float>((Matrix44<float> *)h_00,local_34);
  Imath_3_2::Matrix44<float>::rotate<float>(in_RSI,in_RDX);
  dVar2 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)h_00,(double)in_RDI,
                     (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  a = (float)dVar2;
  dVar2 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)h_00,(double)in_RDI,
                     (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  b = (float)dVar2;
  dVar2 = Imath_3_2::Rand48::nextf
                    ((Rand48 *)h_00,(double)in_RDI,
                     (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffa8,a,b,(float)dVar2);
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    dVar2 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)h_00,(double)in_RDI,
                       (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (0.5 <= dVar2) {
      pfVar1 = Imath_3_2::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffa8,local_5c);
      *pfVar1 = *pfVar1 * -1.0;
    }
  }
  Imath_3_2::Matrix44<float>::shear<float>
            ((Matrix44<float> *)h_00,(Vec3<float> *)&stack0xffffffffffffffa8);
  Imath_3_2::Matrix44<float>::scale<float>
            ((Matrix44<float> *)h_00,(Vec3<float> *)&stack0xffffffffffffffb4);
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
      dVar2 = Imath_3_2::Rand48::nextf
                        ((Rand48 *)h_00,(double)in_RDI,
                         (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff74 = (float)dVar2;
      pfVar1 = Imath_3_2::Matrix44<float>::operator[]((Matrix44<float> *)h_00,local_60);
      pfVar1[local_64] = in_stack_ffffffffffffff74 + pfVar1[local_64];
    }
  }
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff90);
  Imath_3_2::extractSHRT<float>
            (in_stack_ffffffffffffff90,(Vec3<float> *)CONCAT44(a,b),h_00,in_RDI,
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (bool)in_stack_ffffffffffffff6f);
  return (M44f *)in_RDI;
}

Assistant:

M44f
createRandomMat (Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{

    M44f M;
    V3f  t, r, s;
    getRandTRS (random, t, r, s);

    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)));

    for (int j = 0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5) h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += float(random.nextf (-1e-7, 1e-7));

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));

    return M;
}